

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O0

bool __thiscall
EOPlus::Parser::GetTokenIf
          (Parser *this,Token *t,function<bool_(const_EOPlus::Token_&)> *f,uint allow)

{
  bool bVar1;
  pointer pPVar2;
  variant local_168;
  Token local_128;
  Token local_c8;
  Token local_78;
  uint local_24;
  function<bool_(const_EOPlus::Token_&)> *pfStack_20;
  uint allow_local;
  function<bool_(const_EOPlus::Token_&)> *f_local;
  Token *t_local;
  Parser *this_local;
  
  local_24 = allow;
  pfStack_20 = f;
  f_local = (function<bool_(const_EOPlus::Token_&)> *)t;
  t_local = (Token *)this;
  pPVar2 = std::
           unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
           ::operator->(&this->tok);
  Parser_Token_Server_Base::GetToken(&local_78,pPVar2,local_24);
  Token::operator=((Token *)f_local,&local_78);
  Token::~Token(&local_78);
  bVar1 = Token::operator_cast_to_bool((Token *)f_local);
  if ((bVar1) &&
     (bVar1 = std::function<bool_(const_EOPlus::Token_&)>::operator()(f,(Token *)f_local), !bVar1))
  {
    pPVar2 = std::
             unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
             ::operator->(&this->tok);
    Token::Token(&local_c8,(Token *)f_local);
    Parser_Token_Server_Base::PutBack(pPVar2,&local_c8);
    Token::~Token(&local_c8);
    util::variant::variant(&local_168);
    Token::Token(&local_128,Invalid,&local_168);
    Token::operator=((Token *)f_local,&local_128);
    Token::~Token(&local_128);
    util::variant::~variant(&local_168);
  }
  bVar1 = Token::operator_cast_to_bool((Token *)f_local);
  return bVar1;
}

Assistant:

bool GetTokenIf(Token& t, std::function<bool(const Token&)> f, unsigned int allow = 0xFFFFFFFF)
			{
				t = this->tok->GetToken(allow);

				if (t && !f(t))
				{
					this->tok->PutBack(t);
					t = Token();
				}

				return bool(t);
			}